

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingScanPartial<duckdb::uhugeint_t,duckdb::hugeint_t,duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  BitpackingMode BVar1;
  byte width;
  data_ptr_t pdVar2;
  idx_t iVar3;
  uint64_t uVar4;
  uhugeint_t *puVar5;
  bool bVar6;
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *pBVar7;
  long lVar8;
  ulong uVar9;
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this;
  data_ptr_t pdVar10;
  idx_t iVar11;
  idx_t iVar12;
  uint uVar13;
  uint64_t *puVar14;
  uhugeint_t *out;
  ulong uVar15;
  uhugeint_t uVar16;
  hugeint_t hVar17;
  hugeint_t frame_of_reference;
  hugeint_t previous_value;
  uhugeint_t local_a8;
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *local_90;
  uhugeint_t local_88;
  uhugeint_t *local_78;
  uhugeint_t *local_70;
  data_ptr_t local_68;
  data_ptr_t local_60;
  uhugeint_t local_58;
  uhugeint_t local_48;
  
  pBVar7 = (BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)
           unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    pdVar10 = pdVar2 + result_offset * 0x10;
    local_70 = pBVar7->decompression_buffer;
    local_78 = &pBVar7->current_delta_offset;
    local_68 = pdVar2 + result_offset * 0x10 + 8;
    iVar12 = 0;
    this = pBVar7;
    local_90 = pBVar7;
    local_60 = pdVar10;
    do {
      if (this->current_group_offset == 0x800) {
        BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::LoadNextGroup(this);
      }
      puVar5 = local_70;
      iVar3 = this->current_group_offset;
      BVar1 = (this->current_group).mode;
      uVar9 = scan_count - iVar12;
      if (BVar1 == CONSTANT_DELTA) {
        uVar15 = 0x800 - iVar3;
        if (uVar9 < 0x800 - iVar3) {
          uVar15 = uVar9;
        }
        if (uVar15 != 0) {
          puVar14 = (uint64_t *)(local_68 + iVar12 * 0x10);
          uVar9 = 0;
          do {
            local_88.lower = (pBVar7->current_constant).lower;
            local_88.upper = (pBVar7->current_constant).upper;
            uhugeint_t::uhugeint_t(&local_58,this->current_group_offset + uVar9);
            local_a8 = uhugeint_t::operator*(&local_88,&local_58);
            local_48.lower = (pBVar7->current_frame_of_reference).lower;
            local_48.upper = (pBVar7->current_frame_of_reference).upper;
            uVar16 = uhugeint_t::operator+(&local_a8,&local_48);
            puVar14[-1] = uVar16.lower;
            *puVar14 = uVar16.upper;
            uVar9 = uVar9 + 1;
            puVar14 = puVar14 + 2;
            pdVar10 = local_60;
          } while (uVar15 != uVar9);
        }
      }
      else if (BVar1 == CONSTANT) {
        uVar15 = 0x800 - iVar3;
        if (uVar9 < 0x800 - iVar3) {
          uVar15 = uVar9;
        }
        if (scan_count != iVar12) {
          lVar8 = iVar12 << 4;
          do {
            uVar4 = (pBVar7->current_constant).upper;
            *(uint64_t *)(pdVar10 + lVar8) = (pBVar7->current_constant).lower;
            *(uint64_t *)((long)(pdVar10 + lVar8) + 8) = uVar4;
            lVar8 = lVar8 + 0x10;
          } while (scan_count << 4 != lVar8);
        }
      }
      else {
        uVar13 = (uint)iVar3 & 0x1f;
        uVar15 = 0x20 - (ulong)uVar13;
        if (uVar9 < uVar15) {
          uVar15 = uVar9;
        }
        width = this->current_width;
        out = (uhugeint_t *)(pdVar10 + iVar12 * 0x10);
        iVar11 = iVar12;
        if ((uVar15 == 0x20) && ((ulong)uVar13 == 0)) {
          HugeIntPacker::Unpack
                    ((uint32_t *)
                     (this->current_group_ptr +
                     ((width * iVar3 >> 3) - (ulong)(width * uVar13 >> 3))),out,width);
        }
        else {
          HugeIntPacker::Unpack
                    ((uint32_t *)
                     (this->current_group_ptr +
                     ((width * iVar3 >> 3) - (ulong)(width * uVar13 >> 3))),local_70,width);
          switchD_00b1522a::default
                    (out,(void *)((long)&puVar5->lower + (ulong)(uVar13 << 4)),uVar15 << 4);
        }
        this = local_90;
        if ((local_90->current_group).mode == DELTA_FOR) {
          hVar17 = uhugeint_t::operator_cast_to_hugeint_t(&pBVar7->current_frame_of_reference);
          frame_of_reference.lower = hVar17.upper;
          frame_of_reference.upper = uVar15;
          ApplyFrameOfReference<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)hVar17.lower,frame_of_reference,iVar11);
          puVar5 = local_78;
          hVar17 = uhugeint_t::operator_cast_to_hugeint_t(local_78);
          previous_value.lower = hVar17.upper;
          previous_value.upper = uVar15;
          DeltaDecode<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)hVar17.lower,previous_value,iVar11);
          uVar4 = out[uVar15 - 1].upper;
          puVar5->lower = out[uVar15 - 1].lower;
          puVar5->upper = uVar4;
        }
        else {
          local_a8 = local_90->current_frame_of_reference;
          bVar6 = uhugeint_t::operator!(&local_a8);
          this = local_90;
          uVar9 = uVar15;
          if (scan_count != iVar12 && !bVar6) {
            do {
              local_88.lower = local_a8.lower;
              local_88.upper = local_a8.upper;
              uhugeint_t::operator+=(out,&local_88);
              out = out + 1;
              uVar9 = uVar9 - 1;
              this = local_90;
            } while (uVar9 != 0);
          }
        }
      }
      this->current_group_offset = this->current_group_offset + uVar15;
      iVar12 = iVar12 + uVar15;
    } while (iVar12 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}